

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateNoExcept
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errorCodes,vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,CommandFlavourFlags flavourFlags,bool vectorSizeCheck,bool raii)

{
  ulong *puVar1;
  ulong uVar2;
  ulong *puVar3;
  size_t sVar4;
  char *pcVar5;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  char *__s;
  bool bVar9;
  
  __s = "";
  if ((errorCodes->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (errorCodes->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    if ((flavourFlags.m_mask & 4) == 0) {
      puVar3 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar1 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar3 != puVar1) {
        p_Var6 = &(vectorParams->_M_t)._M_impl.super__Rb_tree_header;
        bVar9 = false;
        do {
          uVar2 = *puVar3;
          p_Var8 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var7 = &p_Var6->_M_header;
          for (; p_Var8 != (_Base_ptr)0x0;
              p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < uVar2]) {
            if (*(ulong *)(p_Var8 + 1) >= uVar2) {
              p_Var7 = p_Var8;
            }
          }
          p_Var8 = &p_Var6->_M_header;
          if (((_Rb_tree_header *)p_Var7 != p_Var6) &&
             (p_Var8 = p_Var7, uVar2 < *(ulong *)(p_Var7 + 1))) {
            p_Var8 = &p_Var6->_M_header;
          }
          if ((_Rb_tree_header *)p_Var8 != p_Var6) break;
          puVar3 = puVar3 + 1;
          bVar9 = puVar3 == puVar1;
        } while (!bVar9);
        if (!bVar9) goto LAB_0015a6a9;
      }
    }
    pcVar5 = " VULKAN_HPP_NOEXCEPT_WHEN_NO_EXCEPTIONS";
    if (raii) {
      pcVar5 = "";
    }
    __s = " VULKAN_HPP_NOEXCEPT";
    if (vectorSizeCheck) {
      __s = pcVar5;
    }
  }
LAB_0015a6a9:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar4 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateNoExcept( std::vector<std::string> const &          errorCodes,
                                                  std::vector<size_t> const &               returnParams,
                                                  std::map<size_t, VectorParamData> const & vectorParams,
                                                  CommandFlavourFlags                       flavourFlags,
                                                  bool                                      vectorSizeCheck,
                                                  bool                                      raii ) const
{
  // noexcept is only possible with no error codes, and the return param (if any) is not a vector param (unless it's the singular version)
  return ( errorCodes.empty() && ( ( flavourFlags & CommandFlavourFlagBits::singular ) || returnParams.empty() ||
                                   std::ranges::none_of( returnParams, [&vectorParams]( size_t rp ) { return vectorParams.contains( rp ); } ) ) )
         ? ( vectorSizeCheck ? ( raii ? "" : " VULKAN_HPP_NOEXCEPT_WHEN_NO_EXCEPTIONS" ) : " VULKAN_HPP_NOEXCEPT" )
         : "";
}